

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor-inl.h
# Opt level: O1

executor * __thiscall spdlog::details::executor::operator()(executor *this,json *params)

{
  value_t t;
  context *pcVar1;
  json_value jVar2;
  bool bVar3;
  reference other;
  string_type *key;
  reference pvVar4;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin3;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __end3;
  undefined1 local_128 [8];
  json_value local_120;
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_118;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_110;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_a0;
  
  if (this->ctx_ != (context *)0x0) {
    local_118.container = params;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&local_a0.anchor,params);
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::iteration_proxy_value(&local_110,&local_a0.anchor);
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::end(&local_a0,&local_118);
    while( true ) {
      bVar3 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator==(&local_110.anchor,&local_a0.anchor);
      if (bVar3) break;
      other = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_110.anchor);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_128,other);
      pcVar1 = this->ctx_;
      key = nlohmann::detail::
            iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::key(&local_110);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&(pcVar1->msg).params_buffer,key);
      t = pvVar4->m_type;
      pvVar4->m_type = local_128[0];
      jVar2 = pvVar4->m_value;
      pvVar4->m_value = local_120;
      local_128[0] = t;
      local_120 = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)(local_128 + 8),t);
      if ((local_110.anchor.m_object)->m_type == array) {
        local_110.anchor.m_it.array_iterator._M_current =
             local_110.anchor.m_it.array_iterator._M_current + 1;
      }
      else if ((local_110.anchor.m_object)->m_type == object) {
        local_110.anchor.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_110.anchor.m_it.object_iterator._M_node);
      }
      else {
        local_110.anchor.m_it.primitive_iterator.m_it =
             local_110.anchor.m_it.primitive_iterator.m_it + 1;
      }
      local_110.array_index = local_110.array_index + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.empty_str._M_dataplus._M_p != &local_a0.empty_str.field_2) {
      operator_delete(local_a0.empty_str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.array_index_str._M_dataplus._M_p != &local_a0.array_index_str.field_2) {
      operator_delete(local_a0.array_index_str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.empty_str._M_dataplus._M_p != &local_110.empty_str.field_2) {
      operator_delete(local_110.empty_str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.array_index_str._M_dataplus._M_p != &local_110.array_index_str.field_2) {
      operator_delete(local_110.array_index_str._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

SPDLOG_INLINE executor &executor::operator()(const nlohmann::json &params)
{
    if (ctx_)
    {
        for (const auto &kv : params.items())
        {
            ctx_->msg.params_buffer[kv.key()] = kv.value();
        }
    }
    return *this;
}